

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_align_byte(bitstream *str,vs_align_byte_mode mode)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  int *in_RDI;
  uint32_t tmp;
  uint32_t pad;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe4;
  
  if (in_ESI == 0) {
    iVar1 = 0;
  }
  else if (in_ESI == 1) {
    iVar1 = (1 << ((char)in_RDI[7] + 1U & 0x1f)) + -1;
  }
  else {
    if (in_ESI != 2) {
      abort();
    }
    iVar1 = 1 << ((byte)in_RDI[7] & 0x1f);
  }
  if (*in_RDI == 0) {
    if (in_RDI[7] != 7) {
      *(byte *)(in_RDI + 6) = *(byte *)(in_RDI + 6) | (byte)iVar1;
      iVar1 = vs_byte((bitstream *)CONCAT44(in_ESI,iVar1));
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  else {
    if (in_RDI[0xc] != 0) {
      iVar2 = vs_u((bitstream *)CONCAT44(in_ESI,iVar1),
                   (uint32_t *)CONCAT44(in_stack_ffffffffffffffe4,in_ESI),in_stack_ffffffffffffffdc)
      ;
      if (iVar2 != 0) {
        return 1;
      }
      if (in_stack_ffffffffffffffe4 != iVar1) {
        fprintf(_stderr,"Byte alignment bits don\'t match!\n");
        return 1;
      }
    }
    in_RDI[0xc] = 0;
    in_RDI[7] = 7;
  }
  return 0;
}

Assistant:

int vs_align_byte(struct bitstream *str, enum vs_align_byte_mode mode) {
	uint32_t pad;
	switch (mode) {
		case VS_ALIGN_0:
			pad = 0;
			break;
		case VS_ALIGN_1:
			pad = (1 << (str->bitpos + 1)) - 1;
			break;
		case VS_ALIGN_10:
			pad = 1 << str->bitpos;
			break;
		default:
			abort();
	}
	if (str->dir == VS_ENCODE) {
		if (str->bitpos != 7) {
			str->curbyte |= pad;
			if (vs_byte(str))
				return 1;
		}
	} else {
		if (str->hasbyte) {
			uint32_t tmp;
			if (vs_u(str, &tmp, str->bitpos + 1))
				return 1;
			if (tmp != pad) {
				fprintf(stderr, "Byte alignment bits don't match!\n");
				return 1;
			}
		}
		str->hasbyte = 0;
		str->bitpos = 7;
	}
	return 0;
}